

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O3

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetSystemNoiseCovariance
          (DiscreteKalmanFilterHelper *this,MatrixDynSize *Q)

{
  size_t sVar1;
  
  sVar1 = iDynTree::MatrixDynSize::rows();
  if ((sVar1 == this->m_dim_X) && (sVar1 = iDynTree::MatrixDynSize::cols(), sVar1 == this->m_dim_X))
  {
    iDynTree::MatrixDynSize::operator=(&this->m_Q,Q);
    this->m_system_noise_covariance_matrix_set = true;
    return true;
  }
  iDynTree::reportError
            ("DiscreteKalmanFilterHelper","kfSetSystemNoiseCovariance",
             "Could not set KF system noise covariance - dimension mismatch");
  return false;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetSystemNoiseCovariance(const iDynTree::MatrixDynSize& Q)
{
    if ( (Q.rows() != m_dim_X) || (Q.cols() != m_dim_X))
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetSystemNoiseCovariance", "Could not set KF system noise covariance - dimension mismatch");
        return false;
    }

    m_Q = Q;
    m_system_noise_covariance_matrix_set = true;
    return true;
}